

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::Convolution3DLayerParams::ByteSizeLong(Convolution3DLayerParams *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  Convolution3DLayerParams_PaddingType CVar4;
  size_t sVar5;
  size_t sVar6;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  Convolution3DLayerParams *this_local;
  
  data_size = 0;
  sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar5 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_outputshape_cached_byte_size_ = iVar2;
  data_size = sVar5 + data_size;
  bVar1 = has_weights(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weights_);
    data_size = sVar5 + 2 + data_size;
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->bias_);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = outputchannels(this);
  if (iVar3 != 0) {
    iVar3 = outputchannels(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 1 + data_size;
  }
  iVar3 = inputchannels(this);
  if (iVar3 != 0) {
    iVar3 = inputchannels(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 1 + data_size;
  }
  iVar3 = ngroups(this);
  if (iVar3 != 0) {
    iVar3 = ngroups(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 1 + data_size;
  }
  iVar3 = kerneldepth(this);
  if (iVar3 != 0) {
    iVar3 = kerneldepth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = kernelheight(this);
  if (iVar3 != 0) {
    iVar3 = kernelheight(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = kernelwidth(this);
  if (iVar3 != 0) {
    iVar3 = kernelwidth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = stridedepth(this);
  if (iVar3 != 0) {
    iVar3 = stridedepth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = strideheight(this);
  if (iVar3 != 0) {
    iVar3 = strideheight(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = stridewidth(this);
  if (iVar3 != 0) {
    iVar3 = stridewidth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = dilationdepth(this);
  if (iVar3 != 0) {
    iVar3 = dilationdepth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = dilationheight(this);
  if (iVar3 != 0) {
    iVar3 = dilationheight(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = dilationwidth(this);
  if (iVar3 != 0) {
    iVar3 = dilationwidth(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  bVar1 = isdeconvolution(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  CVar4 = paddingtype(this);
  if (CVar4 != Convolution3DLayerParams_PaddingType_CUSTOM) {
    CVar4 = paddingtype(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(CVar4);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingfront(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingfront(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingback(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingback(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingtop(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingtop(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingbottom(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingbottom(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingleft(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingleft(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar3 = custompaddingright(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingright(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    data_size = sVar5 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t Convolution3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Convolution3DLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 87;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 60;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 61;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // int32 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->outputchannels());
  }

  // int32 inputChannels = 2;
  if (this->inputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->inputchannels());
  }

  // int32 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->ngroups());
  }

  // int32 kernelDepth = 20;
  if (this->kerneldepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kerneldepth());
  }

  // int32 kernelHeight = 21;
  if (this->kernelheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelheight());
  }

  // int32 kernelWidth = 22;
  if (this->kernelwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelwidth());
  }

  // int32 strideDepth = 31;
  if (this->stridedepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridedepth());
  }

  // int32 strideHeight = 32;
  if (this->strideheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->strideheight());
  }

  // int32 strideWidth = 33;
  if (this->stridewidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridewidth());
  }

  // int32 dilationDepth = 40;
  if (this->dilationdepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationdepth());
  }

  // int32 dilationHeight = 41;
  if (this->dilationheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationheight());
  }

  // int32 dilationWidth = 42;
  if (this->dilationwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationwidth());
  }

  // bool hasBias = 50;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  // bool isDeconvolution = 86;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
  if (this->paddingtype() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->paddingtype());
  }

  // int32 customPaddingFront = 80;
  if (this->custompaddingfront() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingfront());
  }

  // int32 customPaddingBack = 81;
  if (this->custompaddingback() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingback());
  }

  // int32 customPaddingTop = 82;
  if (this->custompaddingtop() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingtop());
  }

  // int32 customPaddingBottom = 83;
  if (this->custompaddingbottom() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingbottom());
  }

  // int32 customPaddingLeft = 84;
  if (this->custompaddingleft() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingleft());
  }

  // int32 customPaddingRight = 85;
  if (this->custompaddingright() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingright());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}